

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

int16_t place_monster(chunk *c,loc grid,monster_conflict *mon,uint8_t origin)

{
  bitflag *flags;
  monster_drop *pmVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  uint8_t uVar7;
  short sVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  uint32_t uVar11;
  monster *pmVar12;
  monster_conflict *mon_00;
  monster_conflict *pmVar13;
  monster_lore *pmVar14;
  monster_race *pmVar15;
  quest *pqVar16;
  object_kind *k;
  object *poVar17;
  monster_race *pmVar18;
  wchar_t wVar19;
  wchar_t idx;
  quest_artifact *arts;
  quest_artifact *pqVar20;
  wchar_t wVar21;
  artifact *paVar22;
  _Bool local_6d;
  
  wVar9 = mon->midx;
  _Var2 = square_in_bounds((chunk_conflict *)c,grid);
  if (!_Var2) {
    __assert_fail("square_in_bounds(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x6bd,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  pmVar12 = square_monster((chunk_conflict *)c,grid);
  if (pmVar12 != (monster *)0x0) {
    __assert_fail("!square_monster(c, grid)",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x6be,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  if (wVar9 < L'\x01') {
    sVar8 = mon_pop(c);
    if (sVar8 == 0) {
      return 0;
    }
  }
  else {
    sVar8 = (short)mon->midx;
    c->mon_max = c->mon_max + 1;
    c->mon_cnt = c->mon_cnt + 1;
  }
  idx = (wchar_t)sVar8;
  mon_00 = (monster_conflict *)cave_monster((chunk_conflict *)c,idx);
  memcpy(mon_00,mon,0x1f0);
  mon_00->midx = idx;
  square_set_mon((chunk_conflict *)c,grid,idx);
  mon_00->grid = grid;
  pmVar13 = (monster_conflict *)square_monster((chunk_conflict *)c,grid);
  if (pmVar13 != mon_00) {
    __assert_fail("square_monster(c, grid) == new_mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                  ,0x6d4,
                  "int16_t place_monster(struct chunk *, struct loc, struct monster *, uint8_t)");
  }
  monster_group_assign((chunk_conflict *)c,(monster *)mon_00,mon->group_info,L'\0' < wVar9);
  update_mon(mon_00,c,true);
  _Var2 = flag_has_dbg(mon_00->race->flags,0xc,0x17,"new_mon->race->flags","RF_MULTIPLY");
  if (_Var2) {
    c->num_repro = c->num_repro + L'\x01';
  }
  pmVar15 = mon_00->original_race;
  if (pmVar15 == (monster_race *)0x0) {
    pmVar15 = mon_00->race;
  }
  pmVar15->cur_num = pmVar15->cur_num + L'\x01';
  if (origin != '\0') {
    pmVar14 = get_lore(mon_00->race);
    pmVar15 = mon_00->original_race;
    if (pmVar15 == (monster_race *)0x0) {
      pmVar15 = mon_00->race;
    }
    flags = pmVar15->flags;
    _Var2 = flag_has_dbg(flags,0xc,0x31,"effective_race->flags","RF_DROP_GREAT");
    local_6d = true;
    if (!_Var2) {
      local_6d = flag_has_dbg(flags,0xc,0x30,"effective_race->flags","RF_DROP_GOOD");
    }
    _Var3 = flag_has_dbg(flags,0xc,0x29,"effective_race->flags","RF_ONLY_ITEM");
    _Var4 = flag_has_dbg(flags,0xc,0x28,"effective_race->flags","RF_ONLY_GOLD");
    wVar9 = mon_create_drop_count(pmVar15,false,false,(int *)0x0);
    _Var5 = monster_is_unique((monster *)mon_00);
    if (_Var5) {
      wVar19 = wVar9 - (uint)pmVar14->thefts;
      wVar9 = L'\0';
      if (L'\0' < wVar19) {
        wVar9 = wVar19;
      }
    }
    wVar19 = pmVar15->level;
    _Var5 = monster_is_unique((monster *)mon_00);
    wVar21 = wVar19;
    if (_Var5) {
      wVar21 = wVar19 * 2;
      if (wVar19 + L'\x0f' < wVar19 * 2) {
        wVar21 = wVar19 + L'\x0f';
      }
    }
    wVar19 = (c->depth + wVar21) / 2;
    if (wVar19 <= wVar21) {
      wVar19 = wVar21;
    }
    wVar21 = L'd';
    if (wVar19 < L'd') {
      wVar21 = wVar19;
    }
    _Var6 = quest_unique_monster_check(pmVar15);
    if ((_Var6) && (pqVar16 = find_quest((int)player->place), pqVar16 != (quest *)0x0)) {
      for (pqVar20 = pqVar16->arts; paVar22 = a_info, pqVar20 != (quest_artifact *)0x0;
          pqVar20 = pqVar20->next) {
        wVar19 = pqVar20->index;
        k = lookup_kind(a_info[wVar19].tval,a_info[wVar19].sval);
        wVar10 = Rand_div(100);
        if (wVar10 < pqVar20->chance) {
          paVar22 = paVar22 + wVar19;
          poVar17 = (object *)mem_zalloc(0x148);
          object_prep(poVar17,k,L'd',RANDOMISE);
          poVar17->artifact = paVar22;
          copy_artifact_data(poVar17,paVar22);
          mark_artifact_created(paVar22,true);
          poVar17->origin = origin;
          uVar7 = convert_depth_to_origin(c->depth);
          poVar17->origin_depth = uVar7;
          poVar17->origin_place = (int16_t)c->place;
          _Var6 = flag_has_dbg(flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
          pmVar18 = pmVar15;
          if (_Var6) {
            pmVar18 = r_info + pmVar15->ridx;
          }
          poVar17->origin_race = pmVar18;
          poVar17->number = '\x01';
          _Var6 = monster_carry(c,mon_00,poVar17);
          if (!_Var6) {
            mark_artifact_created(poVar17->artifact,false);
            object_wipe(poVar17);
            mem_free(poVar17);
          }
        }
      }
    }
    for (pmVar1 = pmVar15->drops; pmVar1 != (monster_drop *)0x0; pmVar1 = pmVar1->next) {
      uVar11 = Rand_div(100);
      if (uVar11 < pmVar1->percent_chance) {
        if (pmVar1->kind == (object_kind *)0x0) {
          if (pmVar1->tval == L'\0') {
            __assert_fail("drop->tval",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-make.c"
                          ,0x5d6,"_Bool mon_create_drop(struct chunk *, struct monster *, uint8_t)")
            ;
          }
          poVar17 = make_object(c,wVar21,local_6d,_Var2,_Var5,(int32_t *)0x0,pmVar1->tval);
        }
        else {
          poVar17 = (object *)mem_zalloc(0x148);
          object_prep(poVar17,pmVar1->kind,wVar21,RANDOMISE);
          apply_magic(poVar17,wVar21,true,local_6d,_Var2,_Var5);
        }
        if (poVar17 != (object *)0x0) {
          poVar17->origin = origin;
          uVar7 = convert_depth_to_origin(c->depth);
          poVar17->origin_depth = uVar7;
          poVar17->origin_place = (int16_t)c->place;
          _Var6 = flag_has_dbg(flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
          pmVar18 = pmVar15;
          if (_Var6) {
            pmVar18 = r_info + pmVar15->ridx;
          }
          poVar17->origin_race = pmVar18;
          uVar7 = '\x01';
          if (poVar17->artifact == (artifact *)0x0) {
            uVar11 = Rand_div(pmVar1->max - pmVar1->min);
            uVar7 = (char)uVar11 + (char)pmVar1->min;
          }
          poVar17->number = uVar7;
          _Var6 = monster_carry(c,mon_00,poVar17);
          if (!_Var6) {
            object_wipe(poVar17);
            mem_free(poVar17);
          }
        }
      }
    }
    if (L'\0' < wVar9) {
      do {
        if ((_Var3) || ((!_Var4 && (uVar11 = Rand_div(100), 0x31 < (int)uVar11)))) {
          poVar17 = make_object(c,wVar21,local_6d,_Var2,_Var5,(int32_t *)0x0,L'\0');
          if (poVar17 != (object *)0x0) goto LAB_0017dd69;
        }
        else {
          poVar17 = make_gold(wVar21,"any");
LAB_0017dd69:
          poVar17->origin = origin;
          uVar7 = convert_depth_to_origin(c->depth);
          poVar17->origin_depth = uVar7;
          poVar17->origin_place = (int16_t)c->place;
          _Var6 = flag_has_dbg(flags,0xc,2,"race->flags","RF_PLAYER_GHOST");
          pmVar18 = pmVar15;
          if (_Var6) {
            pmVar18 = r_info + pmVar15->ridx;
          }
          poVar17->origin_race = pmVar18;
          _Var6 = monster_carry(c,mon_00,poVar17);
          if (!_Var6) {
            if (poVar17->artifact != (artifact *)0x0) {
              mark_artifact_created(poVar17->artifact,false);
            }
            object_wipe(poVar17);
            mem_free(poVar17);
          }
        }
        wVar9 = wVar9 + L'\xffffffff';
      } while (wVar9 != L'\0');
    }
    if (mon_00->race->mimic_kinds != (monster_mimic *)0x0) {
      mon_create_mimicked_object(c,mon_00,idx);
    }
  }
  return sVar8;
}

Assistant:

int16_t place_monster(struct chunk *c, struct loc grid, struct monster *mon,
		uint8_t origin)
{
	int16_t m_idx;
	struct monster *new_mon;
	struct monster_group_info *info = mon->group_info;
	bool loading = mon->midx > 0;

	assert(square_in_bounds(c, grid));
	assert(!square_monster(c, grid));

	/* Get a new record, or recycle the old one */
	if (loading) {
		m_idx = mon->midx;
		c->mon_max++;
		c->mon_cnt++;
	} else {
		m_idx = mon_pop(c);
		if (!m_idx) return 0;
	}

	/* Copy the monster */
	new_mon = cave_monster(c, m_idx);
	memcpy(new_mon, mon, sizeof(struct monster));

	/* Set the ID */
	new_mon->midx = m_idx;

	/* Set the location */
	square_set_mon(c, grid, new_mon->midx);
	new_mon->grid = grid;
	assert(square_monster(c, grid) == new_mon);

	/* Assign monster to its monster group, or update its entry */
	monster_group_assign(c, new_mon, info, loading);

	update_mon(new_mon, c, true);

	/* Count the number of "reproducers" */
	if (rf_has(new_mon->race->flags, RF_MULTIPLY)) c->num_repro++;

	/* Count racial occurrences */
	if (new_mon->original_race) new_mon->original_race->cur_num++;
	else new_mon->race->cur_num++;

	/* Create the monster's drop, if any */
	if (origin)
		(void)mon_create_drop(c, new_mon, origin);

	/* Make mimics start mimicking */
	if (origin && new_mon->race->mimic_kinds) {
		mon_create_mimicked_object(c, new_mon, m_idx);
	}

	/* Result */
	return m_idx;
}